

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int param_1,char **argv)

{
  bool bVar1;
  allocator<char> local_149;
  string local_148;
  App local_128;
  
  local_128.dir._M_dataplus._M_p = (pointer)&local_128.dir.field_2;
  local_128.dir._M_string_length = 0;
  local_128.dir.field_2._M_local_buf[0] = '\0';
  local_128.error._M_dataplus._M_p = (pointer)&local_128.error.field_2;
  local_128.error._M_string_length = 0;
  local_128.error.field_2._M_local_buf[0] = '\0';
  local_128.unhasher.super__Optional_base<ritobin::BinUnhasher,_false,_false>._M_payload.
  super__Optional_payload<ritobin::BinUnhasher,_true,_false,_false>.
  super__Optional_payload_base<ritobin::BinUnhasher>._M_engaged = false;
  local_128.input_filename._M_dataplus._M_p = (pointer)&local_128.input_filename.field_2;
  local_128.input_filename._M_string_length = 0;
  local_128.input_filename.field_2._M_local_buf[0] = '\0';
  local_128.output_filename._M_dataplus._M_p = (pointer)&local_128.output_filename.field_2;
  local_128.output_filename._M_string_length = 0;
  local_128.output_filename.field_2._M_local_buf[0] = '\0';
  local_128.input_format = (DynamicFormat *)0x0;
  local_128.output_format = (DynamicFormat *)0x0;
  local_128.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_128.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_128.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,*argv,&local_149);
  App::set_dir_from_apppath(&local_128,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  bVar1 = App::run_once(&local_128);
  fwrite("Press enter to exit or close this window...\n",0x2c,1,_stderr);
  getc(_stdin);
  App::~App(&local_128);
  return (uint)!bVar1;
}

Assistant:

int main(int, char** argv) {
    App app = {};
    app.set_dir_from_apppath(argv[0]);
    bool result = app.run_once();
    fprintf(stderr, "Press enter to exit or close this window...\n");
    [[maybe_unused]] int c = getc(stdin);
    return result ? EXIT_SUCCESS : EXIT_FAILURE;
}